

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall Reader::processsemisec(Reader *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  ProcessedToken *pPVar4;
  invalid_argument *this_00;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  LpSectionKeyword this_section_keyword;
  shared_ptr<Variable> var;
  string name;
  key_type local_64;
  undefined1 local_60 [16];
  __node_base local_50;
  _Hash_node_base local_40 [2];
  
  local_64 = SEMI;
  p_Var1 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < 7]) {
    if (6 < (int)p_Var6[1]._M_color) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, 7 < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    pmVar2 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](&this->sectiontokens,&local_64);
    pmVar3 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](&this->sectiontokens,&local_64);
    pPVar4 = (pmVar2->first)._M_current;
    if (pPVar4 != (pmVar3->second)._M_current) {
      do {
        if (pPVar4->type == VARID) {
          std::__cxx11::string::string
                    ((string *)&local_50,(((pmVar2->first)._M_current)->field_1).name,
                     (allocator *)local_60);
          Builder::getvarbyname((Builder *)local_60,(string *)&this->builder);
          *(uint *)local_60._0_8_ = (*(int *)local_60._0_8_ == 2) + 3;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
          }
          if (local_50._M_nxt != local_40) {
            operator_delete(local_50._M_nxt);
          }
        }
        else {
          if (pPVar4->type != SECID) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_00,"File not existent or illegal file format.");
LAB_001e0d64:
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if ((pPVar4->field_1).keyword != SEMI) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_00,"File not existent or illegal file format.");
            goto LAB_001e0d64;
          }
        }
        pPVar4 = (pmVar2->first)._M_current + 1;
        (pmVar2->first)._M_current = pPVar4;
      } while (pPVar4 != (pmVar3->second)._M_current);
    }
  }
  return;
}

Assistant:

void Reader::processsemisec() {
  const LpSectionKeyword this_section_keyword = LpSectionKeyword::SEMI;
  if (!sectiontokens.count(this_section_keyword)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[this_section_keyword].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[this_section_keyword].second);
  for (; begin != end; ++begin) {
    if (begin->type == ProcessedTokenType::SECID) {
      // Possible to have repeat of keyword for this section type
      lpassert(begin->keyword == this_section_keyword);
      continue;
    }
    lpassert(begin->type == ProcessedTokenType::VARID);
    std::string name = begin->name;
    std::shared_ptr<Variable> var = builder.getvarbyname(name);
    if (var->type == VariableType::GENERAL) {
      var->type = VariableType::SEMIINTEGER;
    } else {
      var->type = VariableType::SEMICONTINUOUS;
    }
  }
}